

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsConflictPool.cpp
# Opt level: O0

void __thiscall HighsConflictPool::removeConflict(HighsConflictPool *this,HighsInt conflict)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  reference pvVar4;
  reference pvVar5;
  reference pvVar6;
  reference pvVar7;
  int in_ESI;
  value_type_conflict2 *in_RDI;
  HighsInt end;
  HighsInt start;
  ConflictPoolPropagation *conflictProp;
  iterator __end1;
  iterator __begin1;
  vector<HighsDomain::ConflictPoolPropagation_*,_std::allocator<HighsDomain::ConflictPoolPropagation_*>_>
  *__range1;
  undefined4 in_stack_ffffffffffffff98;
  HighsInt in_stack_ffffffffffffff9c;
  ConflictPoolPropagation *in_stack_ffffffffffffffa0;
  vector<int,_std::allocator<int>_> *this_00;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffb8;
  undefined7 in_stack_ffffffffffffffb9;
  undefined4 in_stack_ffffffffffffffc0;
  __normal_iterator<HighsDomain::ConflictPoolPropagation_**,_std::vector<HighsDomain::ConflictPoolPropagation_*,_std::allocator<HighsDomain::ConflictPoolPropagation_*>_>_>
  local_20;
  value_type_conflict2 *local_18;
  int local_c;
  
  local_18 = in_RDI + 0x32;
  local_c = in_ESI;
  local_20._M_current =
       (ConflictPoolPropagation **)
       std::
       vector<HighsDomain::ConflictPoolPropagation_*,_std::allocator<HighsDomain::ConflictPoolPropagation_*>_>
       ::begin((vector<HighsDomain::ConflictPoolPropagation_*,_std::allocator<HighsDomain::ConflictPoolPropagation_*>_>
                *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  std::
  vector<HighsDomain::ConflictPoolPropagation_*,_std::allocator<HighsDomain::ConflictPoolPropagation_*>_>
  ::end((vector<HighsDomain::ConflictPoolPropagation_*,_std::allocator<HighsDomain::ConflictPoolPropagation_*>_>
         *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  while( true ) {
    bVar3 = __gnu_cxx::operator!=
                      ((__normal_iterator<HighsDomain::ConflictPoolPropagation_**,_std::vector<HighsDomain::ConflictPoolPropagation_*,_std::allocator<HighsDomain::ConflictPoolPropagation_*>_>_>
                        *)in_stack_ffffffffffffffa0,
                       (__normal_iterator<HighsDomain::ConflictPoolPropagation_**,_std::vector<HighsDomain::ConflictPoolPropagation_*,_std::allocator<HighsDomain::ConflictPoolPropagation_*>_>_>
                        *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
    if (!bVar3) break;
    __gnu_cxx::
    __normal_iterator<HighsDomain::ConflictPoolPropagation_**,_std::vector<HighsDomain::ConflictPoolPropagation_*,_std::allocator<HighsDomain::ConflictPoolPropagation_*>_>_>
    ::operator*(&local_20);
    HighsDomain::ConflictPoolPropagation::conflictDeleted
              (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
    __gnu_cxx::
    __normal_iterator<HighsDomain::ConflictPoolPropagation_**,_std::vector<HighsDomain::ConflictPoolPropagation_*,_std::allocator<HighsDomain::ConflictPoolPropagation_*>_>_>
    ::operator++(&local_20);
  }
  pvVar4 = std::vector<short,_std::allocator<short>_>::operator[]
                     ((vector<short,_std::allocator<short>_> *)(in_RDI + 8),(long)local_c);
  if (-1 < *pvVar4) {
    this_00 = (vector<int,_std::allocator<int>_> *)(in_RDI + 2);
    pvVar4 = std::vector<short,_std::allocator<short>_>::operator[]
                       ((vector<short,_std::allocator<short>_> *)(in_RDI + 8),(long)local_c);
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](this_00,(long)*pvVar4);
    *pvVar5 = *pvVar5 + -1;
    pvVar4 = std::vector<short,_std::allocator<short>_>::operator[]
                       ((vector<short,_std::allocator<short>_> *)(in_RDI + 8),(long)local_c);
    *pvVar4 = -1;
  }
  pvVar6 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                     ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                      (in_RDI + 0x1a),(long)local_c);
  iVar1 = pvVar6->first;
  pvVar6 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                     ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                      (in_RDI + 0x1a),(long)local_c);
  iVar2 = pvVar6->second;
  std::vector<int,_std::allocator<int>_>::push_back(in_stack_ffffffffffffffb0,in_RDI);
  std::set<std::pair<int,int>,std::less<std::pair<int,int>>,std::allocator<std::pair<int,int>>>::
  emplace<int,int&>((set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
                     *)CONCAT44(iVar2 - iVar1,in_stack_ffffffffffffffc0),
                    (int *)CONCAT71(in_stack_ffffffffffffffb9,in_stack_ffffffffffffffb8),
                    (int *)in_stack_ffffffffffffffb0);
  pvVar6 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                     ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                      (in_RDI + 0x1a),(long)local_c);
  pvVar6->first = -1;
  pvVar6 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                     ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                      (in_RDI + 0x1a),(long)local_c);
  pvVar6->second = -1;
  pvVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                     ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 0xe),
                      (long)local_c);
  *pvVar7 = *pvVar7 + 1;
  return;
}

Assistant:

void HighsConflictPool::removeConflict(HighsInt conflict) {
  for (HighsDomain::ConflictPoolPropagation* conflictProp : propagationDomains)
    conflictProp->conflictDeleted(conflict);

  if (ages_[conflict] >= 0) {
    ageDistribution_[ages_[conflict]] -= 1;
    ages_[conflict] = -1;
  }

  HighsInt start = conflictRanges_[conflict].first;
  HighsInt end = conflictRanges_[conflict].second;

  // register the space of the deleted row and the index so that it can be
  // reused
  deletedConflicts_.push_back(conflict);
  freeSpaces_.emplace(end - start, start);

  // set the range to -1,-1 to indicate a deleted row
  conflictRanges_[conflict].first = -1;
  conflictRanges_[conflict].second = -1;
  ++modification_[conflict];
}